

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void ImportModuleTypedefs(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  ByteCode *code;
  ScopeData *pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ExternTypedefInfo *pEVar6;
  size_t sVar7;
  undefined4 extraout_var;
  TypeBase *pTVar9;
  TypeBase *pTVar10;
  AliasData *alias;
  char *pcVar11;
  ulong uVar12;
  InplaceStr aliasName;
  TraceScope traceScope;
  char *local_58;
  InplaceStr local_50;
  TraceScope local_40;
  SynIdentifier *pSVar8;
  undefined4 extraout_var_00;
  
  if (ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') {
    iVar3 = __cxa_guard_acquire(&ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)::
                                 token);
    if (iVar3 != 0) {
      ImportModuleTypedefs::token = NULLC::TraceGetToken("analyze","ImportModuleTypedefs");
      __cxa_guard_release(&ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_40,ImportModuleTypedefs::token);
  code = moduleCtx->data->bytecode;
  pcVar5 = FindSymbols(code);
  pEVar6 = FindFirstTypedef(code);
  if (code->typedefCount != 0) {
    uVar12 = 0;
    local_58 = "ERROR: type \'%.*s\' alias \'%s\' is equal to previously imported class";
    do {
      pcVar11 = pcVar5 + pEVar6->offsetToName;
      local_50.begin = pcVar11;
      sVar7 = strlen(pcVar11);
      local_50.end = pcVar11 + sVar7;
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar8 = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
      (pSVar8->super_SynBase).typeID = 4;
      (pSVar8->super_SynBase).begin = (Lexeme *)0x0;
      (pSVar8->super_SynBase).end = (Lexeme *)0x0;
      (pSVar8->super_SynBase).pos.begin = (char *)0x0;
      (pSVar8->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(pSVar8->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(pSVar8->super_SynBase).next + 2) = 0;
      (pSVar8->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
      (pSVar8->name).begin = local_50.begin;
      (pSVar8->name).end = local_50.end;
      pTVar9 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar6->targetType);
      if (pTVar9 == (TypeBase *)0x0) {
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,source,"ERROR: can\'t find alias \'%s\' target type in module %.*s",
                   pcVar5 + pEVar6->offsetToName,
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                (int)(moduleCtx->data->name).begin));
      }
      uVar4 = NULLC::GetStringHash(local_50.begin,local_50.end);
      pTVar10 = anon_unknown.dwarf_9fd58::LookupTypeByName(ctx,uVar4);
      if (pTVar10 == (TypeBase *)0x0) {
        if (pEVar6->parentType == 0xffffffff) {
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
          alias = (AliasData *)CONCAT44(extraout_var_00,iVar3);
          pSVar1 = ctx->scope;
          uVar4 = ctx->uniqueAliasId;
          ctx->uniqueAliasId = uVar4 + 1;
          alias->source = source;
          alias->scope = pSVar1;
          alias->type = pTVar9;
          alias->name = pSVar8;
          alias->uniqueId = uVar4;
          alias->importModule = (ModuleData *)0x0;
          uVar4 = NULLC::GetStringHash((pSVar8->name).begin,(pSVar8->name).end);
          alias->nameHash = uVar4;
          alias->importModule = moduleCtx->data;
          ExpressionContext::AddAlias(ctx,alias);
        }
      }
      else {
        bVar2 = InplaceStr::operator==(&pTVar10->name,&local_50);
        if (bVar2) {
LAB_00176922:
          pcVar11 = (pTVar9->name).begin;
          anon_unknown.dwarf_9fd58::Stop
                    (ctx,source,local_58,(ulong)(uint)(*(int *)&(pTVar9->name).end - (int)pcVar11),
                     pcVar11,pcVar5 + pEVar6->offsetToName);
        }
        if (pTVar10 != pTVar9) {
          local_58 = "ERROR: type \'%.*s\' alias \'%s\' is equal to previously imported alias";
          goto LAB_00176922;
        }
      }
      uVar12 = uVar12 + 1;
      pEVar6 = pEVar6 + 1;
    } while (uVar12 < code->typedefCount);
  }
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void ImportModuleTypedefs(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleTypedefs");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import type aliases
	ExternTypedefInfo *aliasList = FindFirstTypedef(bCode);

	for(unsigned i = 0; i < bCode->typedefCount; i++)
	{
		ExternTypedefInfo &alias = aliasList[i];

		InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

		SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

		TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

		if(!targetType)
			Stop(ctx, source, "ERROR: can't find alias '%s' target type in module %.*s", symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

		if(TypeBase *type = LookupTypeByName(ctx, aliasName.hash()))
		{
			if(type->name == aliasName)
				Stop(ctx, source, "ERROR: type '%.*s' alias '%s' is equal to previously imported class", FMT_ISTR(targetType->name), symbols + alias.offsetToName);

			if(type != targetType)
				Stop(ctx, source, "ERROR: type '%.*s' alias '%s' is equal to previously imported alias", FMT_ISTR(targetType->name), symbols + alias.offsetToName);
		}
		else if(alias.parentType != ~0u)
		{
			// Type alises were imported during type import
		}
		else
		{
			AliasData *alias = new (ctx.get<AliasData>()) AliasData(source, ctx.scope, targetType, aliasNameIdentifier, ctx.uniqueAliasId++);

			alias->importModule = moduleCtx.data;

			ctx.AddAlias(alias);
		}
	}
}